

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

aint __thiscall CStructureEntry2::ParseValue(CStructureEntry2 *this,char **p)

{
  int iVar1;
  bool bVar2;
  uint local_24;
  bool keepRelocatableFlags;
  char **ppcStack_20;
  aint val;
  char **p_local;
  CStructureEntry2 *this_local;
  
  if ((((this->type == SMEMBBYTE) || (this->type == SMEMBWORD)) || (this->type == SMEMBDWORD)) ||
     (this->type == SMEMBD24)) {
    ppcStack_20 = p;
    p_local = (char **)this;
    SkipBlanks(p);
    local_24 = this->def;
    bVar2 = false;
    if (**ppcStack_20 != '{') {
      iVar1 = ParseExpressionNoSyntaxError(ppcStack_20,(aint *)&local_24);
      bVar2 = iVar1 != 0;
      if (!bVar2) {
        local_24 = this->def;
      }
      switch(this->type) {
      case SMEMBBYTE:
        check8(local_24);
        local_24 = local_24 & 0xff;
        break;
      case SMEMBWORD:
        check16(local_24);
        local_24 = local_24 & 0xffff;
        break;
      default:
        break;
      case SMEMBDWORD:
        break;
      case SMEMBD24:
        check24(local_24);
        local_24 = local_24 & 0xffffff;
      }
    }
    if (Relocation::type == 0) {
      this_local._4_4_ = local_24;
    }
    else {
      if ((this->type == SMEMBBYTE) && (Relocation::type == 2)) {
        if (!bVar2) {
          Relocation::isResultAffected =
               (Relocation::isResultAffected & 1) != 0 || this->defDeltaType != OFF;
          Relocation::deltaType = this->defDeltaType;
        }
        Relocation::resolveRelocationAffected(0,HIGH);
      }
      else if (this->type == SMEMBWORD) {
        if (!bVar2) {
          Relocation::isResultAffected =
               (Relocation::isResultAffected & 1) != 0 || this->defDeltaType != OFF;
          Relocation::deltaType = this->defDeltaType;
        }
        Relocation::resolveRelocationAffected(0,REGULAR);
      }
      Relocation::checkAndWarn(false);
      this_local._4_4_ = local_24;
    }
  }
  else {
    this_local._4_4_ = this->def;
  }
  return this_local._4_4_;
}

Assistant:

aint CStructureEntry2::ParseValue(char* & p) {
	if (SMEMBBYTE != type && SMEMBWORD != type && SMEMBDWORD != type && SMEMBD24 != type) return def;
	SkipBlanks(p);
	aint val = def;
	bool keepRelocatableFlags = false;	// keep flags from the ParseExpressionNoSyntaxError?
	// check for unexpected {
	if ('{' != *p) {
		if (!(keepRelocatableFlags = ParseExpressionNoSyntaxError(p, val))) {
			val = def;
		}
		switch (type) {
			case SMEMBBYTE:
				check8(val);
				val &= 0xFF;
				break;
			case SMEMBWORD:
				check16(val);
				val &= 0xFFFF;
				break;
			case SMEMBD24:
				check24(val);
				val &= 0xFFFFFF;
				break;
			case SMEMBDWORD:
				break;
			default:
				break;
		}
	}
	if (!Relocation::type) return val;
	if (SMEMBBYTE == type && Relocation::HIGH == Relocation::type) {
		if (!keepRelocatableFlags) {	// override flags, if parse expression was not successful
			Relocation::isResultAffected |= bool(defDeltaType);
			Relocation::deltaType = defDeltaType;
		}
		Relocation::resolveRelocationAffected(0, Relocation::HIGH);
	} else if (SMEMBWORD == type) {
		if (!keepRelocatableFlags) {	// override flags, if parse expression was not successful
			Relocation::isResultAffected |= bool(defDeltaType);
			Relocation::deltaType = defDeltaType;
		}
		Relocation::resolveRelocationAffected(0);
	}
	Relocation::checkAndWarn();
	return val;
}